

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cc
# Opt level: O3

Parser * xLearn::CreateParser(char *format_name)

{
  Parser *pPVar1;
  allocator local_31;
  string local_30;
  
  if (GetRegistry_xLearn_parser_registry()::registry == '\0') {
    CreateParser();
  }
  std::__cxx11::string::string((string *)&local_30,format_name,&local_31);
  pPVar1 = ObjectCreatorRegistry_xLearn_parser_registry::CreateObject
                     ((ObjectCreatorRegistry_xLearn_parser_registry *)
                      GetRegistry_xLearn_parser_registry()::registry,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return pPVar1;
}

Assistant:

Parser* CreateParser(const char* format_name) {
  return CREATE_PARSER(format_name);
}